

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

Frame * rw::Frame::create(void)

{
  Frame *object;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/frame.cpp line: 31"
  ;
  object = (Frame *)(*Engine::memfuncs)((long)s_plglist,0x3000e);
  if (object == (Frame *)0x0) {
    create();
    object = (Frame *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    (object->object).parent = (void *)0x0;
    (object->object).type = '\0';
    (object->object).subType = '\0';
    (object->object).flags = '\0';
    (object->object).privateFlags = '\0';
    (object->objectList).link.next = &(object->objectList).link;
    (object->objectList).link.prev = &(object->objectList).link;
    object->child = (Frame *)0x0;
    object->next = (Frame *)0x0;
    object->root = object;
    Matrix::setIdentity(&object->matrix);
    Matrix::setIdentity(&object->ltm);
    PluginList::construct((PluginList *)&s_plglist,object);
  }
  return object;
}

Assistant:

Frame*
Frame::create(void)
{
	Frame *f = (Frame*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_FRAMELIST);
	if(f == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	f->object.init(Frame::ID, 0);
	f->objectList.init();
	f->child = nil;
	f->next = nil;
	f->root = f;
	f->matrix.setIdentity();
	f->ltm.setIdentity();
	s_plglist.construct(f);
	return f;
}